

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O2

void __thiscall QWhatsThat::paintEvent(QWhatsThat *this,QPaintEvent *param_1)

{
  long lVar1;
  Representation RVar2;
  Representation RVar3;
  Representation RVar4;
  Representation RVar5;
  bool bVar6;
  QPalette *pQVar7;
  QBrush *pQVar8;
  long *plVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int x1;
  undefined8 *puVar13;
  PaintContext *pPVar14;
  int iVar15;
  int iVar16;
  long in_FS_OFFSET;
  byte bVar17;
  QRect QVar18;
  undefined8 local_b8;
  int iStack_b0;
  int iStack_ac;
  QPainter p;
  QRect local_98;
  PaintContext context;
  
  bVar17 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = dropShadow();
  QVar18 = QWidget::rect(&this->super_QWidget);
  local_98._0_8_ = QVar18._0_8_;
  local_98.x2.m_i = QVar18.x2.m_i.m_i + -1;
  local_98.y2.m_i = QVar18.y2.m_i.m_i + -1;
  if (bVar6) {
    local_98.x2.m_i = local_98.x2.m_i - shadowWidth;
    local_98.y2.m_i = local_98.y2.m_i - shadowWidth;
  }
  _p = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,&(this->super_QWidget).super_QPaintDevice);
  pQVar7 = QWidget::palette(&this->super_QWidget);
  pQVar8 = QPalette::toolTipText(pQVar7);
  QPen::QPen((QPen *)&context,pQVar8,0.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)&p);
  QPen::~QPen((QPen *)&context);
  pQVar7 = QWidget::palette(&this->super_QWidget);
  QPalette::toolTipBase(pQVar7);
  QPainter::setBrush((QBrush *)&p);
  QPainter::drawRect(&p,&local_98);
  RVar5.m_i = local_98.y2.m_i;
  RVar4.m_i = local_98.x2.m_i;
  RVar2.m_i = local_98.x1.m_i;
  RVar3.m_i = local_98.y1.m_i;
  iVar10 = local_98.x2.m_i - local_98.x1.m_i;
  iVar16 = local_98.y2.m_i - local_98.y1.m_i;
  pQVar7 = QWidget::palette(&this->super_QWidget);
  QPalette::brush(pQVar7,Dark);
  QPainter::setPen((QColor *)&p);
  QPainter::drawRect(&p,1,1,iVar10 + -1,iVar16 + -1);
  if (bVar6) {
    pQVar7 = QWidget::palette(&this->super_QWidget);
    QPalette::shadow(pQVar7);
    QPainter::setPen((QColor *)&p);
    iVar12 = iVar10 + 6;
    QPainter::drawPoint(&p,iVar12,6);
    QPainter::drawLine(&p,iVar10 + 4,6,iVar12,8);
    QPainter::drawLine(&p,iVar10 + 2,6,iVar12,10);
    for (iVar15 = 0; iVar15 + 7 < iVar16 + 1; iVar15 = iVar15 + 2) {
      QPainter::drawLine(&p,iVar10 + 1,iVar15 + 7,iVar12,iVar15 + 0xc);
    }
    iVar10 = 0;
    for (iVar12 = (((RVar5.m_i + RVar4.m_i) - RVar3.m_i) - RVar2.m_i) - iVar15; x1 = iVar12 + -5,
        6 < x1; iVar12 = iVar12 + -2) {
      QPainter::drawLine(&p,x1,iVar16 + 1,iVar12,iVar16 + 6);
      iVar10 = iVar10 + -2;
    }
    iVar10 = ((RVar2.m_i - RVar4.m_i) + 0xc + iVar15) - iVar10;
    for (; 0 < x1; x1 = x1 + -2) {
      QPainter::drawLine(&p,6,iVar10,x1 + 5,iVar16 + 6);
      iVar10 = iVar10 + 2;
    }
  }
  local_98.x2.m_i = local_98.x2.m_i + 1;
  local_98.y2.m_i = local_98.y2.m_i + 1;
  pQVar7 = QWidget::palette(&this->super_QWidget);
  QPalette::toolTipText(pQVar7);
  QPainter::setPen((QColor *)&p);
  local_98.x1.m_i = local_98.x1.m_i + 0xc;
  local_98.y1.m_i = local_98.y1.m_i + 8;
  local_98.x2.m_i = local_98.x2.m_i + -0xc;
  local_98.y2.m_i = local_98.y2.m_i + -8;
  if (this->doc == (QTextDocument *)0x0) {
    QPainter::drawText((QRect *)&p,(int)&local_98,(QString *)0x1421,(QRect *)&this->text);
  }
  else {
    QPainter::translate(&p,(double)local_98.x1.m_i,(double)local_98.y1.m_i);
    local_b8 = 0;
    _iStack_b0 = CONCAT44(local_98.y2.m_i - local_98.y1.m_i,local_98.x2.m_i - local_98.x1.m_i);
    QPainter::setClipRect((QRect *)&p,(ClipOperation)&local_b8);
    puVar13 = &DAT_00653ff8;
    pPVar14 = &context;
    for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
      *(undefined8 *)pPVar14 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
      pPVar14 = (PaintContext *)((long)pPVar14 + (ulong)bVar17 * -0x10 + 8);
    }
    QAbstractTextDocumentLayout::PaintContext::PaintContext(&context);
    pQVar8 = QPalette::toolTipText(&context.palette);
    QPalette::setBrush(&context.palette,Text,pQVar8);
    plVar9 = (long *)QTextDocument::documentLayout();
    (**(code **)(*plVar9 + 0x60))(plVar9,(QRect *)&p,&context);
    QAbstractTextDocumentLayout::PaintContext::~PaintContext(&context);
  }
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThat::paintEvent(QPaintEvent*)
{
    const bool drawShadow = dropShadow();

    QRect r = rect();
    r.adjust(0, 0, -1, -1);
    if (drawShadow)
        r.adjust(0, 0, -shadowWidth, -shadowWidth);
    QPainter p(this);
    p.setPen(QPen(palette().toolTipText(), 0));
    p.setBrush(palette().toolTipBase());
    p.drawRect(r);
    int w = r.width();
    int h = r.height();
    p.setPen(palette().brush(QPalette::Dark).color());
    p.drawRect(1, 1, w-2, h-2);
    if (drawShadow) {
        p.setPen(palette().shadow().color());
        p.drawPoint(w + 5, 6);
        p.drawLine(w + 3, 6, w + 5, 8);
        p.drawLine(w + 1, 6, w + 5, 10);
        int i;
        for(i=7; i < h; i += 2)
            p.drawLine(w, i, w + 5, i + 5);
        for(i = w - i + h; i > 6; i -= 2)
            p.drawLine(i, h, i + 5, h + 5);
        for(; i > 0 ; i -= 2)
            p.drawLine(6, h + 6 - i, i + 5, h + 5);
    }
    r.adjust(0, 0, 1, 1);
    p.setPen(palette().toolTipText().color());
    r.adjust(hMargin, vMargin, -hMargin, -vMargin);

    if (doc) {
        p.translate(r.x(), r.y());
        QRect rect = r;
        rect.translate(-r.x(), -r.y());
        p.setClipRect(rect);
        QAbstractTextDocumentLayout::PaintContext context;
        context.palette.setBrush(QPalette::Text, context.palette.toolTipText());
        doc->documentLayout()->draw(&p, context);
    }
    else
    {
        p.drawText(r, Qt::AlignLeft | Qt::AlignTop | Qt::TextWordWrap | Qt::TextExpandTabs, text);
    }
}